

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

compare_eq_result_container<QList<unsigned_short>,_unsigned_short> __thiscall
QList<unsigned_short>::operator==(QList<unsigned_short> *this,QList<unsigned_short> *other)

{
  short *psVar1;
  short *psVar2;
  long lVar3;
  unsigned_short *puVar4;
  unsigned_short *puVar5;
  long lVar6;
  compare_eq_result_container<QList<unsigned_short>,_unsigned_short> cVar7;
  bool bVar8;
  
  lVar3 = (this->d).size;
  lVar6 = (other->d).size;
  if (lVar3 == lVar6) {
    puVar4 = (this->d).ptr;
    puVar5 = (other->d).ptr;
    if (puVar4 == puVar5) {
      return true;
    }
    if (lVar3 == lVar6) {
      cVar7 = lVar3 == 0;
      if (!cVar7) {
        if (*puVar4 != *puVar5) {
          return false;
        }
        lVar6 = 2;
        do {
          bVar8 = lVar3 * 2 == lVar6;
          if (bVar8) {
            return bVar8;
          }
          psVar1 = (short *)((long)puVar4 + lVar6);
          cVar7 = false;
          psVar2 = (short *)((long)puVar5 + lVar6);
          lVar6 = lVar6 + 2;
        } while (*psVar1 == *psVar2);
      }
      return cVar7;
    }
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }